

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngstest.c
# Opt level: O1

void gpc_b16c(Pixel *out,Pixel *in,Background *back)

{
  uint uVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  
  if (in->a < 1) {
    out->r = back->ir;
    out->g = back->ig;
    uVar1 = back->ib;
  }
  else {
    dVar3 = (double)in->a / 65535.0;
    dVar4 = 1.0 - dVar3;
    dVar3 = dVar3 / 65535.0;
    dVar2 = (double)in->r * dVar3 + back->dr * dVar4;
    if (dVar2 <= 0.0031308) {
      dVar2 = dVar2 * 12.92;
    }
    else {
      dVar2 = pow(dVar2,0.4166666666666667);
      dVar2 = dVar2 * 1.055 + -0.055;
    }
    dVar2 = floor(dVar2 * 255.0 + 0.5);
    out->r = (int)dVar2 & 0xff;
    dVar2 = (double)in->g * dVar3 + back->dg * dVar4;
    if (dVar2 <= 0.0031308) {
      dVar2 = dVar2 * 12.92;
    }
    else {
      dVar2 = pow(dVar2,0.4166666666666667);
      dVar2 = dVar2 * 1.055 + -0.055;
    }
    dVar2 = floor(dVar2 * 255.0 + 0.5);
    out->g = (int)dVar2 & 0xff;
    dVar2 = (double)in->b * dVar3 + dVar4 * back->db;
    if (dVar2 <= 0.0031308) {
      dVar2 = dVar2 * 12.92;
    }
    else {
      dVar2 = pow(dVar2,0.4166666666666667);
      dVar2 = dVar2 * 1.055 + -0.055;
    }
    dVar2 = floor(dVar2 * 255.0 + 0.5);
    uVar1 = (int)dVar2 & 0xff;
  }
  out->b = uVar1;
  out->a = 0xff;
  return;
}

Assistant:

static void
gpc_b16c(Pixel *out, const Pixel *in, const Background *back)
{
   if (in->a <= 0)
   {
      out->r = back->ir;
      out->g = back->ig;
      out->b = back->ib;
   }

   else
   {
      double a = in->a/65535.;
      double a1 = 1-a;

      a /= 65535;
      out->r = sRGB(in->r * a + back->dr * a1);
      out->g = sRGB(in->g * a + back->dg * a1);
      out->b = sRGB(in->b * a + back->db * a1);
   }

   out->a = 255;
}